

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
::increment(void *this)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  lVar2 = *this;
  lVar8 = 0;
  lVar5 = *(long *)((long)this + 8);
LAB_00724361:
  lVar6 = lVar5 + 0x80;
  if (((int)lVar2 + (int)lVar8 & 0xfU) != 0xe) goto code_r0x00724376;
  *(long *)((long)this + 8) = lVar6;
  lVar6 = lVar2 + lVar8;
  *(long *)this = lVar2 + lVar8 + 2;
  lVar5 = lVar5 + 0x800;
  while( true ) {
    auVar9[0] = -(*(char *)(lVar6 + 2) == '\0');
    auVar9[1] = -(*(char *)(lVar6 + 3) == '\0');
    auVar9[2] = -(*(char *)(lVar6 + 4) == '\0');
    auVar9[3] = -(*(char *)(lVar6 + 5) == '\0');
    auVar9[4] = -(*(char *)(lVar6 + 6) == '\0');
    auVar9[5] = -(*(char *)(lVar6 + 7) == '\0');
    auVar9[6] = -(*(char *)(lVar6 + 8) == '\0');
    auVar9[7] = -(*(char *)(lVar6 + 9) == '\0');
    auVar9[8] = -(*(char *)(lVar6 + 10) == '\0');
    auVar9[9] = -(*(char *)(lVar6 + 0xb) == '\0');
    auVar9[10] = -(*(char *)(lVar6 + 0xc) == '\0');
    auVar9[0xb] = -(*(char *)(lVar6 + 0xd) == '\0');
    auVar9[0xc] = -(*(char *)(lVar6 + 0xe) == '\0');
    auVar9[0xd] = -(*(char *)(lVar6 + 0xf) == '\0');
    auVar9[0xe] = -(*(char *)(lVar6 + 0x10) == '\0');
    auVar9[0xf] = -(*(char *)(lVar6 + 0x11) == '\0');
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe);
    if (uVar7 != 0x7fff) break;
    *(long *)this = lVar6 + 0x12;
    *(long *)((long)this + 8) = lVar5;
    lVar5 = lVar5 + 0x780;
    lVar6 = lVar6 + 0x10;
  }
  uVar7 = uVar7 ^ 0x7fff;
  uVar3 = 0;
  if (uVar7 != 0) {
    for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  if (*(char *)(lVar6 + 2 + (ulong)uVar3) != '\x01') {
    *(ulong *)this = lVar6 + (ulong)uVar3 + 2;
    lVar6 = lVar5 + (ulong)(uVar3 << 7) + -0x780;
    goto LAB_00724395;
  }
  goto LAB_00724412;
code_r0x00724376:
  pcVar4 = (char *)(lVar2 + lVar8 + 1);
  *(char **)this = pcVar4;
  cVar1 = *pcVar4;
  lVar8 = lVar8 + 1;
  lVar5 = lVar6;
  if (cVar1 != '\0') {
    if (cVar1 == '\x01') {
LAB_00724412:
      lVar6 = 0;
    }
LAB_00724395:
    *(long *)((long)this + 8) = lVar6;
    return;
  }
  goto LAB_00724361;
}

Assistant:

inline void increment(std::true_type /* regular layout */) noexcept {
        using diff_type = typename std::pointer_traits<char_pointer>::difference_type;

        for (;;) {
            ++p_;
            if (reinterpret_cast<uintptr_t>(pc()) % sizeof(group_type) == N - 1) {
                pc_ += static_cast<diff_type>(sizeof(group_type) - (N - 1));
                break;
            }
            ++pc_;
            if (!group_type::is_occupied(pc()))
                continue;
            if (BOOST_UNLIKELY(group_type::is_sentinel(pc())))
                p_ = nullptr;
            return;
        }

        for (;;) {
            int mask = reinterpret_cast<group_type*>(pc())->match_occupied();
            if (mask != 0) {
                auto n = unchecked_countr_zero(mask);
                if (BOOST_UNLIKELY(reinterpret_cast<group_type*>(pc())->is_sentinel(n))) {
                    p_ = nullptr;
                }
                else {
                    pc_ += static_cast<diff_type>(n);
                    p_ += static_cast<diff_type>(n);
                }
                return;
            }
            pc_ += static_cast<diff_type>(sizeof(group_type));
            p_ += static_cast<diff_type>(N);
        }
    }